

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O1

int testMMapFileReaderTestsReadData(void)

{
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  SpanSize<18446744073709551615UL> in_RCX;
  difference_type __d1;
  Span<const_char,_18446744073709551615UL> data;
  MMapFileReader reader;
  AutoDeleteTempFile tempfile;
  MMapFileReader MStack_88;
  AutoDeleteTempFile local_48;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_48);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_48);
  data.m_size.m_size = in_RCX.m_size;
  data.m_ptr = (pointer)0xd;
  MILBlob::TestUtil::WriteBlobFile<char_const,18446744073709551615ul>
            ((TestUtil *)psVar2,(string *)"salut! ca va?",data);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_48);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&MStack_88,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength(&MStack_88);
  if (uVar3 == 0xd) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted(&MStack_88);
    if (!bVar1) {
      MILBlob::Blob::MMapFileReader::ReadData(&MStack_88,0,0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                 ,0x7b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,": expected exception, but none thrown.\n",0x27);
      goto LAB_001c8b06;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!(reader.IsEncrypted())",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"(reader.GetLength()) == (uint64_t(13))",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_001c8b06:
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&MStack_88);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_48);
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadData()
{
    AutoDeleteTempFile tempfile;

    std::string_view fileData("salut! ca va?");
    TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::Span<const char>(fileData.data(), fileData.size()));

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(13));
    ML_ASSERT_NOT(reader.IsEncrypted());

    ML_ASSERT_THROWS(reader.ReadData(0, 14), std::range_error);
    ML_ASSERT_THROWS(reader.ReadData(13, 1), std::range_error);

    {
        std::string_view expected("salut");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(0, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        std::string_view expected("ca va");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(7, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        Util::Span<const char> expectedSpan(fileData.data(), fileData.size());

        auto span = reader.ReadData(0, reader.GetLength());
        ML_ASSERT_SPAN_EQ(span, expectedSpan);
    }

    return 0;
}